

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_extract.cpp
# Opt level: O2

void __thiscall duckdb::UnionExtractBindData::~UnionExtractBindData(UnionExtractBindData *this)

{
  (this->super_FunctionData)._vptr_FunctionData = (_func_int **)&PTR__UnionExtractBindData_017b2720;
  LogicalType::~LogicalType(&this->type);
  ::std::__cxx11::string::~string((string *)&this->key);
  FunctionData::~FunctionData(&this->super_FunctionData);
  return;
}

Assistant:

UnionExtractBindData(string key, idx_t index, LogicalType type)
	    : key(std::move(key)), index(index), type(std::move(type)) {
	}